

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

void __thiscall
duckdb::ZSTDCompressionState::NewPage(ZSTDCompressionState *this,bool additional_data_page)

{
  block_id_t bVar1;
  BufferHandle *pBVar2;
  
  bVar1 = FinalizePage(this);
  pBVar2 = GetExtraPageBuffer(this,this->block_id);
  this->block_id = bVar1;
  (this->current_buffer).ptr = pBVar2;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar2->node);
  this->current_buffer_ptr = ((pBVar2->node).ptr)->buffer;
  ResetOutBuffer(this);
  return;
}

Assistant:

void NewPage(bool additional_data_page = false) {
		block_id_t new_id = FinalizePage();
		block_id_t current_block_id = block_id;
		auto &buffer = GetExtraPageBuffer(current_block_id);
		block_id = new_id;
		SetCurrentBuffer(buffer);
		ResetOutBuffer();
	}